

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property_holding_base.hpp
# Opt level: O3

void __thiscall
prop::detail::PropertyHoldingBase<StringHolder>::copy<char_const(&)[4]>
          (PropertyHoldingBase<StringHolder> *this,char (*uref) [4])

{
  allocator local_31;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string((string *)local_30,*uref,&local_31);
  std::__cxx11::string::_M_assign((string *)this);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void copy( V&& uref )
  {
    m_value = ::prop::detail::UnwrapIfProperty<
      typename ::prop::detail::CleanType< V > >::forward(
        std::forward< V >( uref ) );
  }